

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,Operator op)

{
  SizeType SVar1;
  SizeType SVar2;
  SizeType SVar3;
  Frag *pFVar4;
  SizeType SVar5;
  SizeType SVar6;
  
  switch(op) {
  case kZeroOrOne:
    if ((ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_) < 0xc) {
      return false;
    }
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar3 = pFVar4->out;
    SVar5 = pFVar4->minIndex;
    SVar2 = NewState(this,0xffffffff,pFVar4->start,0);
    SVar3 = Append(this,SVar3,SVar2);
    break;
  case kZeroOrMore:
    if ((ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_) < 0xc) {
      return false;
    }
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar3 = pFVar4->out;
    SVar5 = pFVar4->minIndex;
    SVar2 = NewState(this,0xffffffff,pFVar4->start,0);
    Patch(this,SVar3,SVar2);
    SVar3 = SVar2;
    break;
  case kOneOrMore:
    if ((ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_) < 0xc) {
      return false;
    }
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar2 = pFVar4->start;
    SVar1 = pFVar4->out;
    SVar5 = pFVar4->minIndex;
    SVar3 = NewState(this,0xffffffff,SVar2,0);
    Patch(this,SVar1,SVar3);
    break;
  case kConcatenation:
    if ((ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_) < 0x18) {
      __assert_fail("operandStack.GetSize() >= sizeof(Frag) * 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                    ,0x165,
                    "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Eval(Stack<Allocator> &, Operator) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar1 = pFVar4->start;
    SVar3 = pFVar4->out;
    SVar5 = pFVar4->minIndex;
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar2 = pFVar4->start;
    SVar6 = pFVar4->minIndex;
    Patch(this,pFVar4->out,SVar1);
    goto LAB_00144abc;
  case kAlternation:
    if ((ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_) < 0x18) {
      return false;
    }
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar2 = pFVar4->start;
    SVar3 = pFVar4->out;
    SVar5 = pFVar4->minIndex;
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    SVar1 = pFVar4->out;
    SVar6 = pFVar4->minIndex;
    SVar2 = NewState(this,pFVar4->start,SVar2,0);
    SVar3 = Append(this,SVar1,SVar3);
LAB_00144abc:
    if (SVar6 < SVar5) {
      SVar5 = SVar6;
    }
    break;
  default:
    return false;
  }
  pFVar4 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack,1);
  pFVar4->start = SVar2;
  pFVar4->out = SVar3;
  pFVar4->minIndex = SVar5;
  return true;
}

Assistant:

bool Eval(Stack<Allocator>& operandStack, Operator op) {
        switch (op) {
            case kConcatenation:
                RAPIDJSON_ASSERT(operandStack.GetSize() >= sizeof(Frag) * 2);
                {
                    Frag e2 = *operandStack.template Pop<Frag>(1);
                    Frag e1 = *operandStack.template Pop<Frag>(1);
                    Patch(e1.out, e2.start);
                    *operandStack.template Push<Frag>() = Frag(e1.start, e2.out, Min(e1.minIndex, e2.minIndex));
                }
                return true;

            case kAlternation:
                if (operandStack.GetSize() >= sizeof(Frag) * 2) {
                    Frag e2 = *operandStack.template Pop<Frag>(1);
                    Frag e1 = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(e1.start, e2.start, 0);
                    *operandStack.template Push<Frag>() = Frag(s, Append(e1.out, e2.out), Min(e1.minIndex, e2.minIndex));
                    return true;
                }
                return false;

            case kZeroOrOne:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    *operandStack.template Push<Frag>() = Frag(s, Append(e.out, s), e.minIndex);
                    return true;
                }
                return false;

            case kZeroOrMore:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    Patch(e.out, s);
                    *operandStack.template Push<Frag>() = Frag(s, s, e.minIndex);
                    return true;
                }
                return false;

            case kOneOrMore:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    Patch(e.out, s);
                    *operandStack.template Push<Frag>() = Frag(e.start, s, e.minIndex);
                    return true;
                }
                return false;

            default: 
                // syntax error (e.g. unclosed kLeftParenthesis)
                return false;
        }
    }